

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O3

uint32_t farmhash32_sa(char *s,size_t len)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  char *pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  uint uVar9;
  uint32_t uVar10;
  long lVar11;
  uint uVar12;
  undefined4 uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  undefined4 uVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  int iVar22;
  int iVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  uVar14 = (uint)len;
  if (0x18 < len) {
    if (len < 0x28) {
      uVar12 = *(int *)(s + (len - 4)) + uVar14;
      iVar23 = *(int *)(s + (len - 0x10)) + uVar14 + -0x4a380c7d;
      iVar24 = *(int *)(s + (len - 0x14)) + -0x4a380c7d;
      uVar15 = uVar12 >> 0x15 | uVar12 * 0x800;
      uVar9 = (iVar23 * 0x16a88000 | (uint)(iVar23 * -0x3361d2af) >> 0x11) * 0x1b873593 ^ uVar12;
      uVar9 = (iVar24 * 0x16a88000 | (uint)(iVar24 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              (uVar9 >> 0x13 | uVar9 << 0xd) * 5 + 0xe6546b64;
      uVar9 = (uVar15 * 0x16a88000 | uVar15 * -0x3361d2af >> 0x11) * 0x1b873593 ^
              (uVar9 >> 0x13 | uVar9 << 0xd) * 5 + 0xe6546b64;
      uVar20 = len + 1 >> 2;
      uVar19 = len + 1 >> 1;
      iVar23 = *(int *)(s + (uVar19 - 8));
      iVar16 = (uVar9 >> 0x13 | uVar9 << 0xd) * 5 + *(int *)(s + (len - 0xc)) + -0x19ab949c;
      uVar12 = uVar12 + iVar16;
      uVar9 = ((iVar24 + *(int *)(s + (len - 8))) * 0x16a88000 |
              (uint)((iVar24 + *(int *)(s + (len - 8))) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              uVar12;
      iVar24 = (uVar9 >> 0x13 | uVar9 << 0xd) * -0x765bf421;
      uVar14 = crc32(iVar16 + uVar12,iVar24 + -0x5fc6ae11 + *(int *)(s + (len - 0x10)) + uVar14);
      uVar12 = (*(uint *)(s + (uVar20 - 4)) >> 0xc | *(uint *)(s + (uVar20 - 4)) << 0x14) +
               *(int *)(s + (uVar19 - 4));
      iVar16 = (uVar12 >> 3 | uVar12 * 0x20000000) + iVar23;
      uVar9 = (iVar23 * 0x16a88000 | (uint)(iVar23 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              (int)uVar19 + *(int *)(s + uVar20) * -0x3361d2af + uVar14;
      uVar15 = iVar16 + *(int *)(s + (uVar19 - 4));
      uVar9 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              (uVar9 >> 0x13 | uVar9 << 0xd) * 5 + uVar12 + 0xe6546b64;
      uVar14 = ((uVar14 ^ *(uint *)(s + 4)) * 0x16a88000 |
               (uVar14 ^ *(uint *)(s + 4)) * -0x3361d2af >> 0x11) * 0x1b873593 ^
               (uVar9 >> 0x13 | uVar9 << 0xd) * 5 + iVar16 + -0x19ab949c;
      uVar14 = (uVar15 >> 0xc | uVar15 * 0x100000) + *(int *)(s + uVar20) + -0x19ab949c +
               (uVar14 >> 0x13 | uVar14 << 0xd) * 5;
      uVar14 = (uVar14 >> 0x10 ^ uVar14) * -0x7a143595;
      uVar14 = (uVar14 >> 0xd ^ uVar14) * -0x3d4d51cb;
      uVar10 = (uVar14 >> 0x10 ^ uVar14) + 0xea715e6c + iVar24;
    }
    else {
      if (len < 0x50) {
        auVar37._8_4_ = 0xcc9e2d51;
        auVar37._0_8_ = 0xcc9e2d51cc9e2d51;
        auVar37._12_4_ = 0xcc9e2d51;
        auVar33._8_4_ = 0xbe0c56a1;
        auVar33._0_8_ = 0xbe0c56a1be0c56a1;
        auVar33._12_4_ = 0xbe0c56a1;
        auVar28 = vpmulld_avx(*(undefined1 (*) [16])(s + (len - 0x10)),auVar37);
        auVar30 = vpshufd_avx(*(undefined1 (*) [16])(s + 0x10),0x39);
        auVar29 = vpaddd_avx(*(undefined1 (*) [16])(s + (len - 0xf >> 1)),auVar33);
        auVar30 = vpaddd_avx(auVar30,auVar33);
        auVar26 = vpaddd_avx(*(undefined1 (*) [16])s,auVar29);
        auVar28 = vpaddd_avx(auVar28,*(undefined1 (*) [16])(s + 0x10));
        auVar27._8_4_ = 0x51;
        auVar27._0_8_ = 0x5100000051;
        auVar27._12_4_ = 0x51;
        auVar25 = vpaddd_avx512vl(auVar26,auVar27);
        auVar26 = vpmulld_avx(*(undefined1 (*) [16])(s + (len - 0x20)),auVar37);
        auVar26 = vprold_avx512vl(auVar26,0x11);
        auVar7._8_4_ = 0x1b873593;
        auVar7._0_8_ = 0x1b8735931b873593;
        auVar7._12_4_ = 0x1b873593;
        auVar26 = vpmulld_avx512vl(auVar26,auVar7);
        auVar29 = vpaddd_avx(auVar25,auVar29);
        auVar26 = vprold_avx512vl(auVar26 ^ auVar25,0x13);
        auVar25 = vpslld_avx(auVar26,2);
        auVar26 = vpaddd_avx(*(undefined1 (*) [16])(s + (len - 0x10)),auVar26);
        auVar31._8_4_ = 0xe6546b64;
        auVar31._0_8_ = 0xe6546b64e6546b64;
        auVar31._12_4_ = 0xe6546b64;
        auVar26 = vpaddd_avx(auVar26,auVar25);
        auVar34 = vpshufb_avx(auVar30,auVar29);
        auVar25 = vpaddd_avx(auVar30 ^ *(undefined1 (*) [16])(s + (len - 0xf >> 1)),
                             *(undefined1 (*) [16])s);
        auVar30 = vpaddd_avx(auVar28 ^ auVar29,*(undefined1 (*) [16])(s + (len - 0x20)));
        auVar29 = vpaddd_avx(auVar26,auVar31);
        auVar27 = vpbroadcastd_avx512vl();
        auVar6 = vpshufb_avx(auVar30,auVar29);
        auVar26 = vpaddd_avx(auVar28,auVar34 ^ auVar31);
        auVar30 = vpaddd_avx(auVar30,auVar25);
        auVar26 = vpaddd_avx(auVar26,auVar6);
        auVar28 = vpaddd_avx(auVar30,auVar25);
        auVar28 = vpmulld_avx(auVar28,auVar37);
        auVar28 = vpaddd_avx(auVar28,auVar27);
      }
      else {
        uVar19 = (len - 1) / 0x50;
        lVar8 = uVar19 * 0x50;
        lVar11 = len + uVar19 * -0x50;
        if (len == 0x50) {
          auVar28._8_4_ = 0xbe0c56a1;
          auVar28._0_8_ = 0xbe0c56a1be0c56a1;
          auVar28._12_4_ = 0xbe0c56a1;
          auVar29._8_4_ = 0x51;
          auVar29._0_8_ = 0x5100000051;
          auVar29._12_4_ = 0x51;
          auVar26._8_8_ = 0xe6546b64e6546b64;
          auVar26._0_8_ = 0xe6546b64e6546b64;
          auVar30 = auVar28;
        }
        else {
          auVar30._8_4_ = 0xbe0c56a1;
          auVar30._0_8_ = 0xbe0c56a1be0c56a1;
          auVar30._12_4_ = 0xbe0c56a1;
          auVar26._8_8_ = 0xe6546b64e6546b64;
          auVar26._0_8_ = 0xe6546b64e6546b64;
          auVar29._8_4_ = 0x51;
          auVar29._0_8_ = 0x5100000051;
          auVar29._12_4_ = 0x51;
          auVar25._8_4_ = 0xcc9e2d51;
          auVar25._0_8_ = 0xcc9e2d51cc9e2d51;
          auVar25._12_4_ = 0xcc9e2d51;
          auVar34._8_4_ = 0x1b873593;
          auVar34._0_8_ = 0x1b8735931b873593;
          auVar34._12_4_ = 0x1b873593;
          pauVar21 = (undefined1 (*) [16])s;
          auVar28 = auVar30;
          do {
            pauVar1 = pauVar21 + 4;
            pauVar2 = pauVar21 + 1;
            pauVar3 = pauVar21 + 3;
            auVar6 = *pauVar21;
            pauVar4 = pauVar21 + 2;
            pauVar21 = pauVar21 + 5;
            uVar19 = uVar19 - 1;
            auVar36 = vpmulld_avx(*pauVar1,auVar25);
            auVar28 = vpaddd_avx(*pauVar2,auVar28);
            auVar29 = vpaddd_avx(auVar6,auVar29);
            auVar30 = vpaddd_avx(*pauVar4,auVar30);
            auVar27 = vpaddd_avx(*pauVar1,auVar26);
            auVar29 = vpaddd_avx(auVar29,auVar30);
            auVar31 = vpshufd_avx(auVar28,0x39);
            auVar30 = vpaddd_avx(auVar29,auVar30);
            auVar36 = vpaddd_avx(auVar36,*pauVar2);
            auVar28 = vpmulld_avx(*pauVar3,auVar25);
            auVar28 = vprold_avx512vl(auVar28,0x11);
            auVar28 = vpmulld_avx(auVar28,auVar34);
            auVar29 = vprold_avx512vl(auVar28 ^ auVar29,0x13);
            auVar28 = vpslld_avx(auVar29,2);
            auVar29 = vpaddd_avx(auVar28,auVar29);
            auVar7 = vpshufb_avx(auVar31,auVar30);
            auVar29 = vpaddd_avx(auVar27,auVar29);
            auVar28 = vpaddd_avx(*pauVar4 ^ auVar31,auVar6);
            auVar30 = vpaddd_avx(*pauVar3,auVar30 ^ auVar36);
            auVar6 = vpshufb_avx(auVar30,auVar29);
            auVar30 = vpaddd_avx(auVar30,auVar28);
            auVar28 = vpaddd_avx(auVar30,auVar28);
            auVar30 = vpmulld_avx(auVar30,auVar25);
            auVar26 = vpaddd_avx(auVar36,auVar7 ^ auVar26);
            auVar26 = vpaddd_avx(auVar26,auVar6);
          } while (uVar19 != 0);
          s = s + lVar8;
        }
        if (lVar11 != 0) {
          auVar36._8_4_ = 0xcc9e2d51;
          auVar36._0_8_ = 0xcc9e2d51cc9e2d51;
          auVar36._12_4_ = 0xcc9e2d51;
          auVar25 = vpbroadcastd_avx512vl();
          auVar29 = vpaddd_avx(auVar29,auVar25);
          auVar34 = vpmulld_avx(*(undefined1 (*) [16])(s + lVar11 + -0x10),auVar36);
          auVar28 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar11 + -0x40),auVar28);
          auVar30 = vpaddd_avx(auVar30,*(undefined1 (*) [16])(s + lVar11 + -0x30));
          auVar25 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar11 + -0x10),auVar26);
          auVar29 = vpaddd_avx(auVar29,*(undefined1 (*) [16])(s + lVar11 + -0x50));
          auVar27 = vpshufd_avx(auVar28,0x39);
          auVar29 = vpaddd_avx(auVar29,auVar30);
          auVar34 = vpaddd_avx(auVar34,*(undefined1 (*) [16])(s + lVar11 + -0x40));
          auVar28 = vpmulld_avx(*(undefined1 (*) [16])(s + lVar11 + -0x20),auVar36);
          auVar30 = vpaddd_avx(auVar29,auVar30);
          auVar28 = vprold_avx512vl(auVar28,0x11);
          auVar6._8_4_ = 0x1b873593;
          auVar6._0_8_ = 0x1b8735931b873593;
          auVar6._12_4_ = 0x1b873593;
          auVar28 = vpmulld_avx512vl(auVar28,auVar6);
          auVar29 = vprold_avx512vl(auVar28 ^ auVar29,0x13);
          auVar28 = vpslld_avx(auVar29,2);
          auVar29 = vpaddd_avx(auVar28,auVar29);
          auVar6 = vpshufb_avx(auVar27,auVar30);
          auVar29 = vpaddd_avx(auVar25,auVar29);
          auVar28 = vpaddd_avx(auVar27 ^ *(undefined1 (*) [16])(s + lVar11 + -0x30),
                               *(undefined1 (*) [16])(s + lVar11 + -0x50));
          auVar30 = vpaddd_avx(auVar30 ^ auVar34,*(undefined1 (*) [16])(s + lVar11 + -0x20));
          auVar25 = vpshufb_avx(auVar30,auVar29);
          auVar30 = vpaddd_avx(auVar30,auVar28);
          auVar28 = vpaddd_avx(auVar30,auVar28);
          auVar30 = vpmulld_avx(auVar30,auVar36);
          auVar26 = vpaddd_avx(auVar34,auVar6 ^ auVar26);
          auVar26 = vpaddd_avx(auVar26,auVar25);
        }
      }
      auVar32._8_4_ = 0xcc9e2d51;
      auVar32._0_8_ = 0xcc9e2d51cc9e2d51;
      auVar32._12_4_ = 0xcc9e2d51;
      auVar35._8_4_ = 0x1b873593;
      auVar35._0_8_ = 0x1b8735931b873593;
      auVar35._12_4_ = 0x1b873593;
      auVar25 = vpshufd_avx(auVar28,0x39);
      auVar30 = vpmulld_avx(auVar30,auVar32);
      auVar28 = vpmulld_avx(auVar25,auVar32);
      auVar29 = vpmulld_avx(auVar29,auVar35);
      auVar26 = vpmulld_avx(auVar25 ^ auVar26,auVar35);
      auVar25 = vpshufb_avx(auVar28,auVar30);
      auVar29 = vpaddd_avx(auVar29,auVar30);
      auVar30 = vpaddd_avx(auVar29,auVar30);
      auVar26 = vpaddd_avx(auVar26,auVar25);
      auVar25 = vpshufb_avx(auVar30,auVar29);
      auVar28 = vpaddd_avx(auVar26,auVar28);
      uVar13 = crc32(auVar30._0_4_,auVar30._12_4_);
      auVar26 = vpaddd_avx(auVar28,auVar26);
      iVar23 = crc32(auVar30._4_4_,auVar28._0_4_);
      auVar26 = auVar26 ^ auVar25;
      iVar24 = crc32(uVar13,auVar28._8_4_);
      uVar13 = crc32(auVar30._8_4_ * -0x3361d2af,auVar28._4_4_);
      iVar23 = crc32(iVar23 * -0x3361d2af,auVar28._12_4_);
      iVar16 = crc32(uVar13,auVar26._0_4_);
      uVar13 = crc32(iVar24 * -0x3361d2af,auVar26._4_4_);
      iVar24 = crc32(iVar23,auVar26._8_4_);
      uVar17 = crc32(iVar16 * -0x3361d2af,auVar26._12_4_);
      uVar13 = crc32(uVar13,auVar29._0_4_);
      iVar22 = crc32(iVar24 * -0x3361d2af,auVar29._4_4_);
      iVar16 = crc32(uVar17,auVar29._8_4_);
      iVar24 = crc32(uVar13,auVar29._12_4_);
      uVar10 = ((iVar22 + iVar23) - (iVar24 + iVar16)) * -0x3361d2af;
    }
    return uVar10;
  }
  if (len < 0xd) {
    if (len < 5) {
      if (len == 0) {
        uVar9 = 0;
        uVar12 = 9;
      }
      else {
        uVar12 = 9;
        uVar9 = 0;
        sVar18 = 0;
        do {
          pcVar5 = s + sVar18;
          sVar18 = sVar18 + 1;
          uVar9 = uVar9 * -0x3361d2af + (int)*pcVar5;
          uVar12 = uVar12 ^ uVar9;
        } while (len != sVar18);
      }
      uVar12 = (uVar14 * 0x16a88000 | uVar14 * -0x3361d2af >> 0x11) * 0x1b873593 ^ uVar12;
      uVar14 = uVar12 >> 0x13 | uVar12 << 0xd;
    }
    else {
      iVar23 = *(int *)(s + (len - 4)) + uVar14 * 5;
      uVar9 = *(int *)(s + (ulong)(uVar14 >> 3 & 1) * 4) + 9;
      uVar14 = ((*(int *)s + uVar14) * 0x16a88000 | (*(int *)s + uVar14) * -0x3361d2af >> 0x11) *
               0x1b873593 ^ uVar14 * 5;
      uVar14 = (iVar23 * 0x16a88000 | (uint)(iVar23 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
               (uVar14 >> 0x13 | uVar14 << 0xd) * 5 + 0xe6546b64;
      uVar14 = uVar14 >> 0x13 | uVar14 << 0xd;
    }
    uVar14 = (uVar9 * 0x16a88000 | uVar9 * -0x3361d2af >> 0x11) * 0x1b873593 ^
             uVar14 * 5 + 0xe6546b64;
    uVar14 = (uVar14 >> 0x13 | uVar14 << 0xd) * 5 + 0xe6546b64;
    uVar14 = uVar14 >> 0x10 ^ uVar14;
  }
  else {
    iVar23 = *(int *)(s + (len - 8));
    uVar9 = (*(uint *)(s + ((len >> 1) - 4)) >> 0xc | *(uint *)(s + ((len >> 1) - 4)) << 0x14) +
            *(int *)(s + (len - 4));
    uVar14 = (iVar23 * 0x16a88000 | (uint)(iVar23 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
             uVar14 + *(int *)(s + (len >> 1)) * -0x3361d2af;
    iVar23 = (uVar9 >> 3 | uVar9 * 0x20000000) + iVar23;
    uVar14 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593 ^
             (uVar14 >> 0x13 | uVar14 << 0xd) * 5 + uVar9 + 0xe6546b64;
    uVar9 = iVar23 + *(int *)(s + (len - 4));
    uVar14 = (*(int *)(s + 4) * 0x16a88000 | (uint)(*(int *)(s + 4) * -0x3361d2af) >> 0x11) *
             0x1b873593 ^ (uVar14 >> 0x13 | uVar14 << 0xd) * 5 + iVar23 + -0x19ab949c;
    uVar14 = (uVar9 >> 0xc | uVar9 * 0x100000) + *(int *)(s + (len >> 1)) + -0x19ab949c +
             (uVar14 >> 0x13 | uVar14 << 0xd) * 5;
    uVar14 = uVar14 >> 0x10 ^ uVar14;
  }
  uVar14 = (uVar14 * -0x7a143595 >> 0xd ^ uVar14 * -0x7a143595) * -0x3d4d51cb;
  return uVar14 >> 0x10 ^ uVar14;
}

Assistant:

uint32_t farmhash32_sa(const char *s, size_t len) {
  const uint32_t seed = 81;
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ?
         farmhash32_mk_len_0_to_4(s, len, 0) :
         farmhash32_mk_len_5_to_12(s, len, 0)) :
        farmhash32_mk_len_13_to_24(s, len, 0);
  }

  if (len < 40) {
    uint32_t a = len, b = seed * c2, c = a + b;
    a += fetch32(s + len - 4);
    b += fetch32(s + len - 20);
    c += fetch32(s + len - 16);
    uint32_t d = a;
    a = ror32(a, 21);
    a = mur(a, mur(b, mur(c, d)));
    a += fetch32(s + len - 12);
    b += fetch32(s + len - 8);
    d += a;
    a += d;
    b = mur(b, d) * c2;
    a = _mm_crc32_u32(a, b + c);
    return farmhash32_mk_len_13_to_24(s, (len + 1) / 2, a) + b;
  }

  const __m128i cc1 = _mm_set1_epi32(c1);
  const __m128i cc2 = _mm_set1_epi32(c2);
  __m128i h = _mm_set1_epi32(seed);
  __m128i g = _mm_set1_epi32(c1 * seed);
  __m128i f = g;
  __m128i k = _mm_set1_epi32(0xe6546b64);
  if (len < 80) {
    __m128i a = fetch128(s);
    __m128i b = fetch128(s + 16);
    __m128i c = fetch128(s + (len - 15) / 2);
    __m128i d = fetch128(s + len - 32);
    __m128i e = fetch128(s + len - 16);
    h = add32x4(h, a);
    g = add32x4(g, b);
    g = shuf32x4_0_3_2_1(g);
    f = add32x4(f, c);
    __m128i be = add32x4(b, mul32x4(e, cc1));
    h = add32x4(h, f);
    f = add32x4(f, h);
    h = add32x4(murk(d, h, cc1, cc2, k), e);
    k = xor128(k, _mm_shuffle_epi8(g, f));
    g = add32x4(xor128(c, g), a);
    f = add32x4(xor128(be, f), d);
    k = add32x4(k, be);
    k = add32x4(k, _mm_shuffle_epi8(f, h));
    f = add32x4(f, g);
    g = add32x4(g, f);
    g = add32x4(_mm_set1_epi32(len), mul32x4(g, cc1));
  } else {
    // len >= 80
    // The following is loosely modelled after farmhash32_mk.
    size_t iters = (len - 1) / 80;
    len -= iters * 80;

#define CHUNK() do {                             \
  __m128i a = fetch128(s);                       \
  __m128i b = fetch128(s + 16);                  \
  __m128i c = fetch128(s + 32);                  \
  __m128i d = fetch128(s + 48);                  \
  __m128i e = fetch128(s + 64);                  \
  h = add32x4(h, a);                             \
  g = add32x4(g, b);                             \
  g = shuf32x4_0_3_2_1(g);                       \
  f = add32x4(f, c);                             \
  __m128i be = add32x4(b, mul32x4(e, cc1));      \
  h = add32x4(h, f);                             \
  f = add32x4(f, h);                             \
  h = add32x4(murk(d, h, cc1, cc2, k), e);       \
  k = xor128(k, _mm_shuffle_epi8(g, f));         \
  g = add32x4(xor128(c, g), a);                  \
  f = add32x4(xor128(be, f), d);                 \
  k = add32x4(k, be);                            \
  k = add32x4(k, _mm_shuffle_epi8(f, h));        \
  f = add32x4(f, g);                             \
  g = add32x4(g, f);                             \
  f = mul32x4(f, cc1);                           \
} while (0)

    while (iters-- != 0) {
      CHUNK();
      s += 80;
    }

    if (len != 0) {
      h = add32x4(h, _mm_set1_epi32(len));
      s = s + len - 80;
      CHUNK();
    }
  }

  g = shuf32x4_0_3_2_1(g);
  k = xor128(k, g);
  f = mul32x4(f, cc1);
  k = mul32x4(k, cc2);
  g = mul32x4(g, cc1);
  h = mul32x4(h, cc2);
  k = add32x4(k, _mm_shuffle_epi8(g, f));
  h = add32x4(h, f);
  f = add32x4(f, h);
  g = add32x4(g, k);
  k = add32x4(k, g);
  k = xor128(k, _mm_shuffle_epi8(f, h));
  __m128i buf[4];
  buf[0] = f;
  buf[1] = g;
  buf[2] = k;
  buf[3] = h;
  s = (char*) buf;
  uint32_t x = fetch32(s);
  uint32_t y = fetch32(s+4);
  uint32_t z = fetch32(s+8);
  x = _mm_crc32_u32(x, fetch32(s+12));
  y = _mm_crc32_u32(y, fetch32(s+16));
  z = _mm_crc32_u32(z * c1, fetch32(s+20));
  x = _mm_crc32_u32(x, fetch32(s+24));
  y = _mm_crc32_u32(y * c1, fetch32(s+28));
  uint32_t o = y;
  z = _mm_crc32_u32(z, fetch32(s+32));
  x = _mm_crc32_u32(x * c1, fetch32(s+36));
  y = _mm_crc32_u32(y, fetch32(s+40));
  z = _mm_crc32_u32(z * c1, fetch32(s+44));
  x = _mm_crc32_u32(x, fetch32(s+48));
  y = _mm_crc32_u32(y * c1, fetch32(s+52));
  z = _mm_crc32_u32(z, fetch32(s+56));
  x = _mm_crc32_u32(x, fetch32(s+60));
  return (o - x + y - z) * c1;
}